

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::createSpvConstant
          (TGlslangToSpvTraverser *this,TIntermTyped *node)

{
  SpvBuildLogger *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint u;
  Id IVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  long lVar6;
  reference pvVar7;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  char *string;
  TConstUnionArray *local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  int local_74;
  TConstUnionArray *pTStack_70;
  int nextConst_1;
  TConstUnionArray *const_union_array;
  TIntermTyped *sub_tree;
  TIntermSymbol *pTStack_58;
  Id result;
  TIntermSymbol *sn;
  byte local_45;
  int local_44;
  undefined1 local_40 [3];
  bool specConst;
  int dim;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimConstId;
  int nextConst;
  TIntermTyped *node_local;
  TGlslangToSpvTraverser *this_local;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])();
  bVar2 = glslang::TQualifier::isConstant((TQualifier *)CONCAT44(extraout_var,iVar3));
  if (!bVar2) {
    __assert_fail("node.getQualifier().isConstant()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x288e,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped &)"
                 );
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])();
  if ((*(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8) >> 0x20 & 1) == 0) {
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])();
    bVar2 = true;
    if (CONCAT44(extraout_var_01,iVar3) == 0) {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])();
      bVar2 = CONCAT44(extraout_var_02,iVar3) != 0;
    }
    if (!bVar2) {
      __assert_fail("node.getAsConstantUnion() != nullptr || node.getAsSymbolNode() != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x2893,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped &)"
                   );
    }
    dimConstId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])();
    if (CONCAT44(extraout_var_04,iVar4) == 0) {
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])();
      local_e8 = glslang::TIntermSymbol::getConstArray
                           ((TIntermSymbol *)CONCAT44(extraout_var_06,iVar4));
    }
    else {
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])();
      local_e8 = glslang::TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_05,iVar4));
    }
    this_local._4_4_ =
         createSpvConstantFromConstUnionArray
                   (this,(TType *)CONCAT44(extraout_var_03,iVar3),local_e8,
                    (int *)((long)&dimConstId.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4),false);
  }
  else {
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = glslang::TType::contains8BitInt((TType *)CONCAT44(extraout_var_07,iVar3));
    if (bVar2) {
      spv::Builder::addCapability(&this->builder,CapabilityInt8);
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = glslang::TType::contains16BitFloat((TType *)CONCAT44(extraout_var_08,iVar3));
    if (bVar2) {
      spv::Builder::addCapability(&this->builder,CapabilityFloat16);
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = glslang::TType::contains16BitInt((TType *)CONCAT44(extraout_var_09,iVar3));
    if (bVar2) {
      spv::Builder::addCapability(&this->builder,CapabilityInt16);
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = glslang::TType::contains64BitInt((TType *)CONCAT44(extraout_var_10,iVar3));
    if (bVar2) {
      spv::Builder::addCapability(&this->builder,CapabilityInt64);
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = glslang::TType::containsDouble((TType *)CONCAT44(extraout_var_11,iVar3));
    if (bVar2) {
      spv::Builder::addCapability(&this->builder,CapabilityFloat64);
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar3) + 0x58))();
    if (((uint)(*(ulong *)(lVar6 + 8) >> 7) & 0x1ff) == 2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        iVar3 = glslang::TIntermediate::getLocalSizeSpecId(this->glslangIntermediate,local_44);
        local_45 = iVar3 != -1;
        u = glslang::TIntermediate::getLocalSize(this->glslangIntermediate,local_44);
        sn._4_4_ = spv::Builder::makeUintConstant(&this->builder,u,(bool)(local_45 & 1));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                   (value_type_conflict *)((long)&sn + 4));
        if ((local_45 & 1) != 0) {
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
          IVar5 = *pvVar7;
          iVar3 = glslang::TIntermediate::getLocalSizeSpecId(this->glslangIntermediate,local_44);
          spv::Builder::addDecoration(&this->builder,IVar5,DecorationSpecId,iVar3);
        }
      }
      IVar5 = spv::Builder::makeUintType(&this->builder,0x20);
      IVar5 = spv::Builder::makeVectorType(&this->builder,IVar5,3);
      this_local._4_4_ =
           spv::Builder::makeCompositeConstant
                     (&this->builder,IVar5,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,true);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    }
    else {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])();
      pTStack_58 = (TIntermSymbol *)CONCAT44(extraout_var_13,iVar3);
      if (pTStack_58 == (TIntermSymbol *)0x0) {
        pSVar1 = this->logger;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Neither a front-end constant nor a spec constant.",&local_c1
                  );
        spv::SpvBuildLogger::missingFunctionality(pSVar1,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        this_local._4_4_ = 0;
      }
      else {
        const_union_array = (TConstUnionArray *)glslang::TIntermSymbol::getConstSubtree(pTStack_58);
        if ((TIntermTyped *)const_union_array == (TIntermTyped *)0x0) {
          pTStack_70 = glslang::TIntermSymbol::getConstArray(pTStack_58);
          if (pTStack_70 == (TConstUnionArray *)0x0) {
            pSVar1 = this->logger;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"Invalid initializer for spec onstant.",&local_99);
            spv::SpvBuildLogger::missingFunctionality(pSVar1,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator(&local_99);
            return 0;
          }
          local_74 = 0;
          iVar3 = (*(pTStack_58->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          sub_tree._4_4_ =
               createSpvConstantFromConstUnionArray
                         (this,(TType *)CONCAT44(extraout_var_15,iVar3),pTStack_70,&local_74,true);
        }
        else {
          (*(((TIntermTyped *)const_union_array)->super_TIntermNode)._vptr_TIntermNode[2])
                    (const_union_array,this);
          iVar3 = (*const_union_array->_vptr_TConstUnionArray[0x1e])();
          sub_tree._4_4_ = accessChainLoad(this,(TType *)CONCAT44(extraout_var_14,iVar3));
        }
        IVar5 = sub_tree._4_4_;
        iVar3 = (*(pTStack_58->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        string = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_16,iVar3));
        spv::Builder::addName(&this->builder,IVar5,string);
        this_local._4_4_ = sub_tree._4_4_;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSpvConstant(const glslang::TIntermTyped& node)
{
    assert(node.getQualifier().isConstant());

    // Handle front-end constants first (non-specialization constants).
    if (! node.getQualifier().specConstant) {
        // hand off to the non-spec-constant path
        assert(node.getAsConstantUnion() != nullptr || node.getAsSymbolNode() != nullptr);
        int nextConst = 0;
        return createSpvConstantFromConstUnionArray(node.getType(), node.getAsConstantUnion() ?
            node.getAsConstantUnion()->getConstArray() : node.getAsSymbolNode()->getConstArray(),
            nextConst, false);
    }

    // We now know we have a specialization constant to build

    // Extra capabilities may be needed.
    if (node.getType().contains8BitInt())
        builder.addCapability(spv::CapabilityInt8);
    if (node.getType().contains16BitFloat())
        builder.addCapability(spv::CapabilityFloat16);
    if (node.getType().contains16BitInt())
        builder.addCapability(spv::CapabilityInt16);
    if (node.getType().contains64BitInt())
        builder.addCapability(spv::CapabilityInt64);
    if (node.getType().containsDouble())
        builder.addCapability(spv::CapabilityFloat64);

    // gl_WorkGroupSize is a special case until the front-end handles hierarchical specialization constants,
    // even then, it's specialization ids are handled by special case syntax in GLSL: layout(local_size_x = ...
    if (node.getType().getQualifier().builtIn == glslang::EbvWorkGroupSize) {
        std::vector<spv::Id> dimConstId;
        for (int dim = 0; dim < 3; ++dim) {
            bool specConst = (glslangIntermediate->getLocalSizeSpecId(dim) != glslang::TQualifier::layoutNotSet);
            dimConstId.push_back(builder.makeUintConstant(glslangIntermediate->getLocalSize(dim), specConst));
            if (specConst) {
                builder.addDecoration(dimConstId.back(), spv::DecorationSpecId,
                                      glslangIntermediate->getLocalSizeSpecId(dim));
            }
        }
        return builder.makeCompositeConstant(builder.makeVectorType(builder.makeUintType(32), 3), dimConstId, true);
    }

    // An AST node labelled as specialization constant should be a symbol node.
    // Its initializer should either be a sub tree with constant nodes, or a constant union array.
    if (auto* sn = node.getAsSymbolNode()) {
        spv::Id result;
        if (auto* sub_tree = sn->getConstSubtree()) {
            // Traverse the constant constructor sub tree like generating normal run-time instructions.
            // During the AST traversal, if the node is marked as 'specConstant', SpecConstantOpModeGuard
            // will set the builder into spec constant op instruction generating mode.
            sub_tree->traverse(this);
            result = accessChainLoad(sub_tree->getType());
        } else if (auto* const_union_array = &sn->getConstArray()) {
            int nextConst = 0;
            result = createSpvConstantFromConstUnionArray(sn->getType(), *const_union_array, nextConst, true);
        } else {
            logger->missingFunctionality("Invalid initializer for spec onstant.");
            return spv::NoResult;
        }
        builder.addName(result, sn->getName().c_str());
        return result;
    }

    // Neither a front-end constant node, nor a specialization constant node with constant union array or
    // constant sub tree as initializer.
    logger->missingFunctionality("Neither a front-end constant nor a spec constant.");
    return spv::NoResult;
}